

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode dupset(Curl_easy *dst,Curl_easy *src)

{
  CURLcode CVar1;
  char *pcVar2;
  size_t length;
  uint local_2c;
  uint local_28;
  dupblob j;
  dupstring i;
  CURLcode result;
  Curl_easy *src_local;
  Curl_easy *dst_local;
  
  memcpy(&dst->set,&src->set,0x8c8);
  Curl_mime_initpart(&(dst->set).mimepost);
  memset((dst->set).str,0,0x280);
  memset((dst->set).blobs,0,0x40);
  for (local_28 = 0; local_28 < 0x4e; local_28 = local_28 + 1) {
    CVar1 = Curl_setstropt((dst->set).str + local_28,(src->set).str[local_28]);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    CVar1 = Curl_setblobopt((dst->set).blobs + local_2c,(src->set).blobs[local_2c]);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  if ((src->set).str[0x4f] != (char *)0x0) {
    if ((src->set).postfieldsize == -1) {
      pcVar2 = (*Curl_cstrdup)((src->set).str[0x4f]);
      (dst->set).str[0x4f] = pcVar2;
    }
    else {
      pcVar2 = (src->set).str[0x4f];
      length = curlx_sotouz((src->set).postfieldsize);
      pcVar2 = (char *)Curl_memdup(pcVar2,length);
      (dst->set).str[0x4f] = pcVar2;
    }
    if ((dst->set).str[0x4f] == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (dst->set).postfields = (dst->set).str[0x4f];
  }
  CVar1 = Curl_mime_duppart(dst,&(dst->set).mimepost,&(src->set).mimepost);
  if ((src->set).resolve != (curl_slist *)0x0) {
    (dst->state).resolve = (dst->set).resolve;
  }
  return CVar1;
}

Assistant:

static CURLcode dupset(struct Curl_easy *dst, struct Curl_easy *src)
{
  CURLcode result = CURLE_OK;
  enum dupstring i;
  enum dupblob j;

  /* Copy src->set into dst->set first, then deal with the strings
     afterwards */
  dst->set = src->set;
  Curl_mime_initpart(&dst->set.mimepost);

  /* clear all dest string and blob pointers first, in case we error out
     mid-function */
  memset(dst->set.str, 0, STRING_LAST * sizeof(char *));
  memset(dst->set.blobs, 0, BLOB_LAST * sizeof(struct curl_blob *));

  /* duplicate all strings */
  for(i = (enum dupstring)0; i< STRING_LASTZEROTERMINATED; i++) {
    result = Curl_setstropt(&dst->set.str[i], src->set.str[i]);
    if(result)
      return result;
  }

  /* duplicate all blobs */
  for(j = (enum dupblob)0; j < BLOB_LAST; j++) {
    result = Curl_setblobopt(&dst->set.blobs[j], src->set.blobs[j]);
    if(result)
      return result;
  }

  /* duplicate memory areas pointed to */
  i = STRING_COPYPOSTFIELDS;
  if(src->set.str[i]) {
    if(src->set.postfieldsize == -1)
      dst->set.str[i] = strdup(src->set.str[i]);
    else
      /* postfieldsize is curl_off_t, Curl_memdup() takes a size_t ... */
      dst->set.str[i] = Curl_memdup(src->set.str[i],
                                    curlx_sotouz(src->set.postfieldsize));
    if(!dst->set.str[i])
      return CURLE_OUT_OF_MEMORY;
    /* point to the new copy */
    dst->set.postfields = dst->set.str[i];
  }

  /* Duplicate mime data. */
  result = Curl_mime_duppart(dst, &dst->set.mimepost, &src->set.mimepost);

  if(src->set.resolve)
    dst->state.resolve = dst->set.resolve;

  return result;
}